

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord3.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord3::RectangularVolumeRecord3(RectangularVolumeRecord3 *this)

{
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__RectangularVolumeRecord3_002197c0;
  WorldCoordinates::WorldCoordinates(&this->m_CentLocation);
  Vector::Vector(&this->m_RecLength);
  EulerAngles::EulerAngles(&this->m_Ori);
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x5000000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x180;
  return;
}

Assistant:

RectangularVolumeRecord3::RectangularVolumeRecord3()
{
    m_ui32EnvRecTyp = RectangularVolumeRecord3Type;
    m_ui16Length = ( RECTANGLE_VOLUME_RECORD_3_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}